

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

void archive_entry_copy_hardlink_w(archive_entry *entry,wchar_t *target)

{
  wchar_t *target_local;
  archive_entry *entry_local;
  
  if ((target != (wchar_t *)0x0) || ((entry->ae_set & 2U) == 0)) {
    archive_mstring_copy_wcs(&entry->ae_linkname,target);
    if (target == (wchar_t *)0x0) {
      entry->ae_set = entry->ae_set & 0xfffffffe;
    }
    else {
      entry->ae_set = entry->ae_set | 1;
    }
  }
  return;
}

Assistant:

void
archive_entry_copy_hardlink_w(struct archive_entry *entry, const wchar_t *target)
{
	if (target == NULL && (entry->ae_set & AE_SET_SYMLINK))
		return;
	archive_mstring_copy_wcs(&entry->ae_linkname, target);
	if (target != NULL)
		entry->ae_set |= AE_SET_HARDLINK;
	else
		entry->ae_set &= ~AE_SET_HARDLINK;
}